

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

par_shapes_mesh * par_shapes_create_cube(void)

{
  par_shapes_mesh *ppVar1;
  float *pfVar2;
  uint16_t *puVar3;
  long *in_FS_OFFSET;
  int local_94;
  uint16_t *puStack_90;
  int p;
  uint16_t *tris;
  uint16_t *local_58;
  uint16_t *quad;
  int ncorners;
  par_shapes_mesh *mesh;
  int nquads;
  
  ppVar1 = (par_shapes_mesh *)rf_calloc_wrapper(*(rf_allocator *)(*in_FS_OFFSET + -0x440),1,0x30);
  ppVar1->npoints = 8;
  pfVar2 = (float *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
  ppVar1->points = pfVar2;
  memcpy(ppVar1->points,par_shapes_create_cube::verts,0x60);
  local_58 = par_shapes_create_cube::quads;
  ppVar1->ntriangles = 0xc;
  puVar3 = (uint16_t *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
  ppVar1->triangles = puVar3;
  puStack_90 = ppVar1->triangles;
  for (local_94 = 0; local_94 < 6; local_94 = local_94 + 1) {
    *puStack_90 = *local_58;
    puStack_90[1] = local_58[1];
    puStack_90[2] = local_58[2];
    puStack_90[3] = local_58[2];
    puVar3 = puStack_90 + 5;
    puStack_90[4] = local_58[3];
    puStack_90 = puStack_90 + 6;
    *puVar3 = *local_58;
    local_58 = local_58 + 4;
  }
  return ppVar1;
}

Assistant:

PARDEF par_shapes_mesh* par_shapes_create_cube()
{
    static float verts[8 * 3] = {
        0, 0, 0, // 0
        0, 1, 0, // 1
        1, 1, 0, // 2
        1, 0, 0, // 3
        0, 0, 1, // 4
        0, 1, 1, // 5
        1, 1, 1, // 6
        1, 0, 1, // 7
    };
    static PAR_SHAPES_T quads[6 * 4] = {
        7,6,5,4, // front
        0,1,2,3, // back
        6,7,3,2, // right
        5,6,2,1, // top
        4,5,1,0, // left
        7,4,0,3, // bottom
    };
    int nquads = sizeof(quads) / sizeof(quads[0]) / 4;
    par_shapes_mesh* mesh = PAR_CALLOC(par_shapes_mesh, 1);
    int ncorners = sizeof(verts) / sizeof(verts[0]) / 3;
    mesh->npoints = ncorners;
    mesh->points = PAR_MALLOC(float, mesh->npoints * 3);
    memcpy(mesh->points, verts, sizeof(verts));
    PAR_SHAPES_T const* quad = quads;
    mesh->ntriangles = nquads * 2;
    mesh->triangles = PAR_MALLOC(PAR_SHAPES_T, mesh->ntriangles * 3);
    PAR_SHAPES_T* tris = mesh->triangles;
    for (int p = 0; p < nquads; p++, quad += 4) {
        *tris++ = quad[0];
        *tris++ = quad[1];
        *tris++ = quad[2];
        *tris++ = quad[2];
        *tris++ = quad[3];
        *tris++ = quad[0];
    }
    return mesh;
}